

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O1

spv_result_t spvtools::anon_unknown_6::getWord(spv_text text,spv_position position,string *word)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  spv_result_t sVar8;
  
  sVar8 = SPV_ERROR_INVALID_TEXT;
  if ((text->str != (char *)0x0) && (text->length != 0)) {
    if (position == (spv_position)0x0) {
      sVar8 = SPV_ERROR_INVALID_POINTER;
    }
    else {
      sVar1 = position->index;
      bVar7 = false;
      bVar4 = false;
      do {
        uVar2 = position->index;
        pcVar3 = text->str;
        if (text->length <= uVar2) {
          std::__cxx11::string::replace
                    ((ulong)word,0,(char *)word->_M_string_length,(ulong)(pcVar3 + sVar1));
          return SPV_SUCCESS;
        }
        uVar6 = (ulong)(byte)pcVar3[uVar2];
        if (uVar6 < 0x3c) {
          if ((0x800000100002600U >> (uVar6 & 0x3f) & 1) == 0) {
            if (uVar6 != 0) {
              if (uVar6 != 0x22) goto LAB_00186628;
              bVar7 = (bool)(bVar4 ^ bVar7 ^ 1);
LAB_00186633:
              bVar4 = false;
              goto LAB_00186635;
            }
          }
          else if ((bVar4) || (bVar7)) goto LAB_00186633;
          bVar5 = false;
          std::__cxx11::string::replace
                    ((ulong)word,0,(char *)word->_M_string_length,(ulong)(pcVar3 + sVar1));
        }
        else {
LAB_00186628:
          if (pcVar3[uVar2] != 0x5c) goto LAB_00186633;
          bVar4 = (bool)(bVar4 ^ 1);
LAB_00186635:
          position->column = position->column + 1;
          position->index = uVar2 + 1;
          bVar5 = true;
        }
      } while (bVar5);
      sVar8 = SPV_SUCCESS;
    }
  }
  return sVar8;
}

Assistant:

spv_result_t getWord(spv_text text, spv_position position, std::string* word) {
  if (!text->str || !text->length) return SPV_ERROR_INVALID_TEXT;
  if (!position) return SPV_ERROR_INVALID_POINTER;

  const size_t start_index = position->index;

  bool quoting = false;
  bool escaping = false;

  // NOTE: Assumes first character is not white space!
  while (true) {
    if (position->index >= text->length) {
      word->assign(text->str + start_index, text->str + position->index);
      return SPV_SUCCESS;
    }
    const char ch = text->str[position->index];
    if (ch == '\\') {
      escaping = !escaping;
    } else {
      switch (ch) {
        case '"':
          if (!escaping) quoting = !quoting;
          break;
        case ' ':
        case ';':
        case '\t':
        case '\n':
        case '\r':
          if (escaping || quoting) break;
          word->assign(text->str + start_index, text->str + position->index);
          return SPV_SUCCESS;
        case '\0': {  // NOTE: End of word found!
          word->assign(text->str + start_index, text->str + position->index);
          return SPV_SUCCESS;
        }
        default:
          break;
      }
      escaping = false;
    }

    position->column++;
    position->index++;
  }
}